

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O3

error_code __thiscall
simdjson::fallback::implementation::minify
          (implementation *this,uint8_t *buf,size_t len,uint8_t *dst,size_t *dst_len)

{
  long lVar1;
  byte bVar2;
  error_code eVar3;
  byte bVar4;
  size_t sVar5;
  size_t sVar6;
  byte bVar7;
  byte bVar8;
  
  if (len == 0) {
    eVar3 = SUCCESS;
    sVar6 = 0;
  }
  else {
    bVar2 = 1;
    sVar5 = 0;
    sVar6 = 0;
    bVar8 = 0;
    do {
      bVar7 = bVar8;
      lVar1 = (ulong)buf[sVar5] * 3;
      bVar4 = jump_table[lVar1] & bVar2;
      bVar8 = bVar4 ^ bVar7;
      dst[sVar6] = buf[sVar5];
      sVar6 = (jump_table[lVar1 + 2] | bVar8) + sVar6;
      sVar5 = sVar5 + 1;
      bVar2 = ~bVar2 | jump_table[lVar1 + 1];
    } while (len != sVar5);
    eVar3 = UNCLOSED_STRING;
    if (bVar4 == bVar7) {
      eVar3 = SUCCESS;
    }
  }
  *dst_len = sVar6;
  return eVar3;
}

Assistant:

simdjson_warn_unused error_code implementation::minify(const uint8_t *buf, size_t len, uint8_t *dst, size_t &dst_len) const noexcept {
  size_t i = 0, pos = 0;
  uint8_t quote = 0;
  uint8_t nonescape = 1;

  while (i < len) {
    unsigned char c = buf[i];
    uint8_t *meta = jump_table + 3 * c;

    quote = quote ^ (meta[0] & nonescape);
    dst[pos] = c;
    pos += meta[2] | quote;

    i += 1;
    nonescape = uint8_t(~nonescape) | (meta[1]);
  }
  dst_len = pos; // we intentionally do not work with a reference
  // for fear of aliasing
  return quote ? UNCLOSED_STRING : SUCCESS;
}